

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall QL_Manager::CleanUpRun(QL_Manager *this,Attr *attributes,RM_FileHandle *relFH)

{
  RC RVar1;
  
  RVar1 = RM_Manager::CloseFile(this->rmm,relFH);
  if (RVar1 != 0) {
    return RVar1;
  }
  RVar1 = SM_Manager::CleanUpAttr(this->smm,attributes,this->relEntries->attrCount);
  return RVar1;
}

Assistant:

RC QL_Manager::CleanUpRun(Attr* attributes, RM_FileHandle &relFH){
  RC rc = 0;
  if( (rc = rmm.CloseFile(relFH)))
    return (rc);

  // Destroy and close the pointers in Attr struct
  if((rc = smm.CleanUpAttr(attributes, relEntries->attrCount)))
    return (rc);
  return (0);
}